

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::PatchPutValueWithThisPtrNoFastPath
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *requestContext;
  ThreadContext *this;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  Var newValue_local;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    SetPropertyOnTaggedNumber
              (instance,(RecyclableObject *)0x0,propertyId,newValue,requestContext,flags);
  }
  else {
    info._56_8_ = VarTo<Js::RecyclableObject>(instance);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
    BVar2 = OP_SetProperty((Var)info._56_8_,propertyId,newValue,requestContext,
                           (PropertyValueInfo *)local_88,flags,thisInstance);
    if (BVar2 == 0) {
      this = ScriptContext::GetThreadContext(requestContext);
      ThreadContext::AddImplicitCallFlags(this,ImplicitCall_NoOpSet);
    }
  }
  return;
}

Assistant:

void JavascriptOperators::PatchPutValueWithThisPtrNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        if (TaggedNumber::Is(instance))
        {
            JavascriptOperators::SetPropertyOnTaggedNumber(instance, nullptr, propertyId, newValue, scriptContext, flags);
            return;
        }
        RecyclableObject* object = VarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        if (!JavascriptOperators::OP_SetProperty(object, propertyId, newValue, scriptContext, &info, flags, thisInstance))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
    }